

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

bool absl::lts_20240722::GenericCompare<bool,std::basic_string_view<char,std::char_traits<char>>>
               (Cord *lhs,basic_string_view<char,_std::char_traits<char>_> *rhs,
               size_t size_to_compare)

{
  string_view rhs_00;
  int iVar1;
  unsigned_long *puVar2;
  const_pointer __s1;
  const_pointer __s2;
  string_view sv;
  size_type sStack_70;
  int memcmp_res;
  size_type local_68;
  ulong local_60;
  size_t compared_size;
  char *local_50;
  undefined1 local_48 [8];
  string_view rhs_chunk;
  string_view lhs_chunk;
  size_t size_to_compare_local;
  basic_string_view<char,_std::char_traits<char>_> *rhs_local;
  Cord *lhs_local;
  
  join_0x00000010_0x00000000_ = Cord::GetFirstChunk(lhs);
  sv._M_str = rhs_chunk._16_8_;
  compared_size = rhs->_M_len;
  local_50 = rhs->_M_str;
  sv._M_len = (size_t)local_50;
  _local_48 = Cord::GetFirstChunk((Cord *)compared_size,sv);
  local_68 = std::basic_string_view<char,_std::char_traits<char>_>::size
                       ((basic_string_view<char,_std::char_traits<char>_> *)&rhs_chunk._M_str);
  sStack_70 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_48);
  puVar2 = std::min<unsigned_long>(&local_68,&stack0xffffffffffffff90);
  local_60 = *puVar2;
  if (local_60 <= size_to_compare) {
    __s1 = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)&rhs_chunk._M_str);
    __s2 = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)local_48);
    iVar1 = memcmp(__s1,__s2,local_60);
    if ((local_60 == size_to_compare) || (iVar1 != 0)) {
      lhs_local._7_1_ = anon_unknown_58::ComputeCompareResult<bool>(iVar1);
    }
    else {
      rhs_00._M_len = rhs->_M_len;
      rhs_00._M_str = rhs->_M_str;
      iVar1 = Cord::CompareSlowPath(lhs,rhs_00,local_60,size_to_compare);
      lhs_local._7_1_ = anon_unknown_58::ComputeCompareResult<bool>(iVar1);
    }
    return lhs_local._7_1_;
  }
  __assert_fail("size_to_compare >= compared_size",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O0/_deps/absl-src/absl/strings/cord.cc"
                ,0x3d7,
                "ResultType absl::GenericCompare(const Cord &, const RHS &, size_t) [ResultType = bool, RHS = std::basic_string_view<char>]"
               );
}

Assistant:

ResultType GenericCompare(const Cord& lhs, const RHS& rhs,
                          size_t size_to_compare) {
  absl::string_view lhs_chunk = Cord::GetFirstChunk(lhs);
  absl::string_view rhs_chunk = Cord::GetFirstChunk(rhs);

  size_t compared_size = std::min(lhs_chunk.size(), rhs_chunk.size());
  assert(size_to_compare >= compared_size);
  int memcmp_res = ::memcmp(lhs_chunk.data(), rhs_chunk.data(), compared_size);
  if (compared_size == size_to_compare || memcmp_res != 0) {
    return ComputeCompareResult<ResultType>(memcmp_res);
  }

  return ComputeCompareResult<ResultType>(
      lhs.CompareSlowPath(rhs, compared_size, size_to_compare));
}